

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall LogFile::write_file(LogFile *this)

{
  pthread_mutex_t *__mutex;
  int __fd;
  char *__s;
  size_type sVar1;
  size_t __n;
  
  __mutex = &this->get_Mutex;
  do {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while( true ) {
      sVar1 = std::deque<char_*,_std::allocator<char_*>_>::size
                        ((deque<char_*,_std::allocator<char_*>_> *)this);
      if (sVar1 != 0) break;
      pthread_cond_broadcast((pthread_cond_t *)&this->Swap_Cond);
      pthread_cond_wait((pthread_cond_t *)&this->get_Cond,(pthread_mutex_t *)__mutex);
    }
    while( true ) {
      sVar1 = std::deque<char_*,_std::allocator<char_*>_>::size
                        ((deque<char_*,_std::allocator<char_*>_> *)this);
      if (sVar1 == 0) break;
      __s = *(this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
      std::deque<char_*,_std::allocator<char_*>_>::pop_front
                ((deque<char_*,_std::allocator<char_*>_> *)this);
      __fd = this->fd;
      __n = strlen(__s);
      write(__fd,__s,__n);
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

void LogFile::write_file()
{
    while(true)
    {
        pthread_mutex_lock(&get_Mutex);
        while(WriteTask.size() == 0)
        {
            pthread_cond_broadcast(&Swap_Cond);
            pthread_cond_wait(&get_Cond,&get_Mutex);
        }
        while(WriteTask.size() > 0)
        {
            char* buff = WriteTask.front();
            WriteTask.pop();
            //写日志文件
            write(fd,(void*)buff,strlen(buff));
            //cout<<"Write LogFile Success!"<<endl;
            delete[] buff;
        }
        pthread_mutex_unlock(&get_Mutex);
    }
}